

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv__iou_fs_statx(uv_loop_t *loop,uv_fs_t *req,int is_fstat,int is_lstat)

{
  byte *pbVar1;
  void *ptr;
  uv__io_uring_sqe *puVar2;
  int iVar3;
  uv__iou *iou;
  
  ptr = uv__malloc(0x100);
  iVar3 = 0;
  if (ptr != (void *)0x0) {
    iou = (uv__iou *)((long)loop->internal_fields + 0x150);
    puVar2 = uv__iou_get_sqe(iou,loop,req);
    if (puVar2 == (uv__io_uring_sqe *)0x0) {
      uv__free(ptr);
      iVar3 = 0;
    }
    else {
      req->ptr = ptr;
      puVar2->field_5 = (anon_union_8_1_898948ef_for_uv__io_uring_sqe_6)req->path;
      (puVar2->field_4).off = (uint64_t)ptr;
      puVar2->fd = -100;
      puVar2->len = 0xfff;
      puVar2->opcode = '\x15';
      if (is_fstat != 0) {
        (puVar2->field_5).addr = (uint64_t)"";
        puVar2->fd = req->file;
        pbVar1 = (byte *)((long)&puVar2->field_7 + 1);
        *pbVar1 = *pbVar1 | 0x10;
      }
      if (is_lstat != 0) {
        pbVar1 = (byte *)((long)&puVar2->field_7 + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      uv__iou_submit(iou);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int uv__iou_fs_statx(uv_loop_t* loop,
                     uv_fs_t* req,
                     int is_fstat,
                     int is_lstat) {
  struct uv__io_uring_sqe* sqe;
  struct uv__statx* statxbuf;
  struct uv__iou* iou;

  statxbuf = uv__malloc(sizeof(*statxbuf));
  if (statxbuf == NULL)
    return 0;

  iou = &uv__get_internal_fields(loop)->iou;

  sqe = uv__iou_get_sqe(iou, loop, req);
  if (sqe == NULL) {
    uv__free(statxbuf);
    return 0;
  }

  req->ptr = statxbuf;

  sqe->addr = (uintptr_t) req->path;
  sqe->addr2 = (uintptr_t) statxbuf;
  sqe->fd = AT_FDCWD;
  sqe->len = 0xFFF; /* STATX_BASIC_STATS + STATX_BTIME */
  sqe->opcode = UV__IORING_OP_STATX;

  if (is_fstat) {
    sqe->addr = (uintptr_t) "";
    sqe->fd = req->file;
    sqe->statx_flags |= 0x1000; /* AT_EMPTY_PATH */
  }

  if (is_lstat)
    sqe->statx_flags |= AT_SYMLINK_NOFOLLOW;

  uv__iou_submit(iou);

  return 1;
}